

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

void __thiscall
GeneratorProfile_defaultConstantValues_Test::~GeneratorProfile_defaultConstantValues_Test
          (GeneratorProfile_defaultConstantValues_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratorProfile, defaultConstantValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ("1.0", generatorProfile->trueString());
    EXPECT_EQ("0.0", generatorProfile->falseString());
    EXPECT_EQ(convertToString(exp(1.0)), generatorProfile->eString());
    EXPECT_EQ(convertToString(M_PI), generatorProfile->piString());
    EXPECT_EQ("INFINITY", generatorProfile->infString());
    EXPECT_EQ("NAN", generatorProfile->nanString());
}